

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O3

void __thiscall CJSON::AddPair<unsigned_int>(CJSON *this,string *Name,uint *val)

{
  uint __val;
  bool bVar1;
  char cVar2;
  char cVar3;
  iterator iVar4;
  mapped_type *this_00;
  CJSONException *this_01;
  long *plVar5;
  size_type *psVar6;
  uint uVar7;
  string __str;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,Name);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->m_Values)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (CJSONException *)__cxa_allocate_exception(0x30);
    std::operator+(&local_48,"Name \'",Name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_68._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_68._M_dataplus._M_p == psVar6) {
      local_68.field_2._M_allocated_capacity = *psVar6;
      local_68.field_2._8_8_ = plVar5[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar6;
    }
    local_68._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    CJSONException::CJSONException(this_01,&local_68,NAME_ALREADY_EXITS);
    __cxa_throw(this_01,&CJSONException::typeinfo,CJSONException::~CJSONException);
  }
  __val = *val;
  cVar3 = '\x01';
  if (9 < __val) {
    uVar7 = __val;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar7 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_00120514;
      }
      if (uVar7 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_00120514;
      }
      if (uVar7 < 10000) goto LAB_00120514;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_00120514:
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_68,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_68._M_dataplus._M_p,(uint)local_68._M_string_length,__val);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_Values,Name);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void AddPair(const std::string &Name, const T &val)
        {
            if(m_Values.find(Name) != m_Values.end())
                throw CJSONException("Name '" + Name + "' already exists!", JSONErrorType::NAME_ALREADY_EXITS);

            m_Values[Name] = ValueToString(val); 
        }